

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::handleExtremes(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp)

{
  Item *this_00;
  fpclass_type fVar1;
  int32_t iVar2;
  uint uVar3;
  pointer pnVar4;
  Tolerances *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Item *pIVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  char cVar7;
  undefined1 *puVar8;
  int iVar9;
  undefined4 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  FreeConstraintPS *this_03;
  int *piVar14;
  long lVar15;
  long lVar16;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *pAVar17;
  undefined4 *puVar18;
  char *pcVar19;
  int iVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  ulong uVar22;
  pointer pnVar23;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  uint *puVar26;
  char *__filename;
  cpp_dec_float<200U,_int,_void> *pcVar27;
  uint *puVar28;
  undefined4 *puVar29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar30;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar31;
  uint uVar32;
  SPxOut *pSVar33;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *lp_00;
  long in_FS_OFFSET;
  byte bVar34;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *pAVar35;
  Real eps;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  undefined1 local_cf8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_cf0;
  undefined1 local_ce8 [16];
  undefined1 local_cd8 [16];
  undefined1 local_cc8 [16];
  undefined1 local_cb8 [16];
  undefined1 local_ca8 [16];
  uint local_c98 [3];
  undefined3 uStack_c8b;
  int iStack_c88;
  bool bStack_c84;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_c80;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c70;
  ulong local_c68;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c60;
  ulong local_c58;
  int local_c4c;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_c48;
  ulong uStack_c40;
  ulong local_c38;
  undefined4 local_c2c;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_c28;
  ulong uStack_c20;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_c18;
  ulong uStack_c10;
  ulong local_c00;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_bf8;
  undefined8 uStack_bf0;
  undefined1 local_be8 [124];
  undefined4 uStack_b6c;
  undefined1 local_b68 [124];
  undefined4 uStack_aec;
  undefined1 local_ae8 [32];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [13];
  undefined3 uStack_a7b;
  int iStack_a78;
  bool bStack_a74;
  undefined8 local_a70;
  shared_ptr<soplex::Tolerances> local_a68;
  undefined1 local_a58 [120];
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_9e0;
  undefined1 local_9d8 [120];
  undefined8 local_960;
  undefined1 local_958 [120];
  undefined8 local_8e0;
  undefined1 local_8d0 [120];
  undefined8 local_858;
  undefined1 local_850 [128];
  undefined1 local_7d0 [128];
  undefined1 local_750 [128];
  undefined1 local_6d0 [128];
  undefined1 local_650 [128];
  undefined1 local_5d0 [128];
  cpp_dec_float<200U,_int,_void> local_550;
  cpp_dec_float<200U,_int,_void> local_4d0;
  cpp_dec_float<200U,_int,_void> local_450;
  cpp_dec_float<200U,_int,_void> local_3d0;
  cpp_dec_float<200U,_int,_void> local_350;
  uint local_2d0 [28];
  undefined4 local_260 [28];
  undefined4 local_1f0 [28];
  uint local_180 [28];
  undefined4 local_110 [28];
  uint local_a0 [28];
  
  bVar34 = 0;
  local_c70 = this;
  local_c60 = lp;
  ::soplex::infinity::__tls_init();
  local_c28 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                **)(in_FS_OFFSET + -8);
  local_8e0._0_4_ = cpp_dec_float_finite;
  local_8e0._4_4_ = 0x1c;
  local_958._0_4_ = 0;
  local_958._4_4_ = 0;
  local_958._8_4_ = 0;
  local_958._12_4_ = 0;
  local_958._16_4_ = 0;
  local_958._20_4_ = 0;
  local_958._24_4_ = 0;
  local_958._28_4_ = 0;
  local_958._32_4_ = 0;
  local_958._36_4_ = 0;
  local_958._40_4_ = 0;
  local_958._44_4_ = 0;
  local_958._48_4_ = 0;
  local_958._52_4_ = 0;
  local_958._56_4_ = 0;
  local_958._60_4_ = 0;
  local_958._64_4_ = 0;
  local_958._68_4_ = 0;
  local_958._72_4_ = 0;
  local_958._76_4_ = 0;
  local_958._80_4_ = 0;
  local_958._84_4_ = 0;
  local_958._88_4_ = 0;
  local_958._92_4_ = 0;
  local_958._96_4_ = 0;
  local_958._100_4_ = 0;
  local_958._104_5_ = 0;
  local_958._109_3_ = 0;
  local_958._112_4_ = 0;
  local_958[0x74] = false;
  uStack_c20 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_958,(double)local_c28);
  local_9e0 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
               *)0x1c00000000;
  local_a58._0_4_ = 0;
  local_a58._4_4_ = 0;
  local_a58._8_4_ = 0;
  local_a58._12_4_ = 0;
  local_a58._16_4_ = 0;
  local_a58._20_4_ = 0;
  local_a58._24_4_ = 0;
  local_a58._28_4_ = 0;
  local_a58._32_4_ = 0;
  local_a58._36_4_ = 0;
  local_a58._40_4_ = 0;
  local_a58._44_4_ = 0;
  local_a58._48_4_ = 0;
  local_a58._52_4_ = 0;
  local_a58._56_4_ = 0;
  local_a58._60_4_ = 0;
  local_a58._64_4_ = 0;
  local_a58._68_4_ = 0;
  local_a58._72_4_ = 0;
  local_a58._76_4_ = 0;
  local_a58._80_4_ = 0;
  local_a58._84_4_ = 0;
  local_a58._88_4_ = 0;
  local_a58._92_4_ = 0;
  local_a58._96_4_ = 0;
  local_a58._100_4_ = 0;
  local_a58._104_5_ = 0;
  local_a58._109_3_ = 0;
  local_a58._112_4_ = 0;
  local_a58[0x74] = false;
  local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
               *)0x1c00000000;
  _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )ZEXT816(0);
  local_ce8 = ZEXT816(0);
  local_cd8 = ZEXT816(0);
  local_cc8 = ZEXT816(0);
  local_cb8 = ZEXT816(0);
  local_ca8 = ZEXT816(0);
  local_c98[0] = 0;
  local_c98[1] = 0;
  stack0xfffffffffffff370 = 0;
  uStack_c8b = 0;
  iStack_c88 = 0;
  bStack_c84 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_cf8,5.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_a58,(cpp_dec_float<200U,_int,_void> *)local_958
             ,(cpp_dec_float<200U,_int,_void> *)local_cf8);
  pSVar31 = local_c70;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)local_b68,local_c70);
  local_8e0._0_4_ = cpp_dec_float_finite;
  local_8e0._4_4_ = 0x1c;
  local_958._0_4_ = 0;
  local_958._4_4_ = 0;
  local_958._8_4_ = 0;
  local_958._12_4_ = 0;
  local_958._16_4_ = 0;
  local_958._20_4_ = 0;
  local_958._24_4_ = 0;
  local_958._28_4_ = 0;
  local_958._32_4_ = 0;
  local_958._36_4_ = 0;
  local_958._40_4_ = 0;
  local_958._44_4_ = 0;
  local_958._48_4_ = 0;
  local_958._52_4_ = 0;
  local_958._56_4_ = 0;
  local_958._60_4_ = 0;
  local_958._64_4_ = 0;
  local_958._68_4_ = 0;
  local_958._72_4_ = 0;
  local_958._76_4_ = 0;
  local_958._80_4_ = 0;
  local_958._84_4_ = 0;
  local_958._88_4_ = 0;
  local_958._92_4_ = 0;
  local_958._96_4_ = 0;
  local_958._100_4_ = 0;
  local_958._104_5_ = 0;
  local_958._109_3_ = 0;
  local_958._112_4_ = 0;
  local_958[0x74] = false;
  local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
               *)0x1c00000000;
  _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )ZEXT816(0);
  local_ce8 = ZEXT816(0);
  local_cd8 = ZEXT816(0);
  local_cc8 = ZEXT816(0);
  local_cb8 = ZEXT816(0);
  local_ca8 = ZEXT816(0);
  local_c98[0] = 0;
  local_c98[1] = 0;
  stack0xfffffffffffff370 = 0;
  uStack_c8b = 0;
  iStack_c88 = 0;
  bStack_c84 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_cf8,0.01);
  pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_b68;
  pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_958;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar25->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
    pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar21 + ((ulong)bVar34 * -2 + 1) * 4);
    pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar34 * -8 + 4);
  }
  local_958._112_4_ = local_b68._112_4_;
  local_958[0x74] = (bool)local_b68[0x74];
  local_8e0 = stack0xfffffffffffff510;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_958,(cpp_dec_float<200U,_int,_void> *)local_cf8
            );
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)local_b68,pSVar31);
  if ((((fpclass_type)local_8e0 == cpp_dec_float_NaN) || (local_b68._120_4_ == cpp_dec_float_NaN))
     || (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_958,
                             (cpp_dec_float<200U,_int,_void> *)local_b68), -1 < iVar12)) {
    puVar18 = (undefined4 *)local_958;
    puVar29 = (undefined4 *)local_cf8;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar29 = *puVar18;
      puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
      puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
    }
    iStack_c88 = local_958._112_4_;
    bStack_c84 = local_958[0x74];
    local_c80 = local_8e0;
  }
  else {
    epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_cf8,local_c70);
  }
  puVar18 = (undefined4 *)local_cf8;
  puVar29 = (undefined4 *)local_958;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar29 = *puVar18;
    puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
    puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
  }
  local_958._112_4_ = iStack_c88;
  local_958[0x74] = bStack_c84;
  local_8e0 = local_c80;
  lVar15 = (long)(local_c60->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  local_c4c = 0;
  local_c58 = 0;
  local_c00 = 0;
  lp_00 = local_c60;
  if (0 < lVar15) {
    local_c48 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                 *)((ulong)local_c28 ^ 0x8000000000000000);
    uStack_c40 = uStack_c20 ^ 0x8000000000000000;
    local_bf8 = &local_c70->m_hist;
    uVar22 = lVar15 << 7;
    local_c00 = 0;
    local_c58 = 0;
    do {
      pnVar4 = (lp_00->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (uint *)((long)pnVar4[-1].m_backend.data._M_elems + uVar22);
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_b68;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pcVar25->data)._M_elems[0] = *puVar26;
        puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar34 * -8 + 4);
      }
      local_b68._112_4_ = *(int *)((long)(pnVar4->m_backend).data._M_elems + uVar22 + -0x10);
      local_b68[0x74] = *(char *)((long)(pnVar4->m_backend).data._M_elems + uVar22 + -0xc);
      unique0x00012000 =
           *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
             **)((long)(pnVar4->m_backend).data._M_elems + uVar22 + -8);
      local_c38 = uVar22;
      iVar12 = (int)lVar15;
      if ((int)unique0x00012000 == 2) {
LAB_00550dc1:
        pAVar17 = stack0xfffffffffffff510;
        bVar11 = (bool)local_b68[0x74];
        uVar10 = local_b68._112_4_;
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_b68;
        puVar26 = local_a0;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          *puVar26 = (pcVar25->data)._M_elems[0];
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar34 * -8 + 4);
          puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
        }
        local_c18 = stack0xfffffffffffff510;
        uStack_c10 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_350,local_c70);
        puVar26 = local_a0;
        puVar28 = (uint *)local_cf8;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          *puVar28 = *puVar26;
          puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
          puVar28 = puVar28 + (ulong)bVar34 * -2 + 1;
        }
        iStack_c88 = uVar10;
        bStack_c84 = bVar11;
        local_c80 = pAVar17;
        if ((bVar11 == true) && (local_cf8._0_4_ != 0 || (int)local_c18 != 0)) {
          bStack_c84 = false;
        }
        uVar22 = local_c38;
        lp_00 = local_c60;
        if ((((int)local_c18 == 2) || (local_350.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_cf8,&local_350),
           uVar22 = local_c38, lp_00 = local_c60, 0 < iVar13)) goto LAB_00550f2e;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        pAVar17 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x0;
LAB_005511b0:
        stack0xfffffffffffff370 = 0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        bStack_c84 = false;
        iStack_c88 = 0;
        uStack_c8b = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)pAVar17);
        (*(lp_00->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])(lp_00,(ulong)(iVar12 - 1),local_cf8,0);
        local_c58 = (ulong)((int)local_c58 + 1);
      }
      else {
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,0.0);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_b68,
                            (cpp_dec_float<200U,_int,_void> *)local_cf8);
        if (iVar13 != 0) goto LAB_00550dc1;
LAB_00550f2e:
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c48);
        if (((local_b68._120_4_ != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_b68,
                                (cpp_dec_float<200U,_int,_void> *)local_cf8), 0 < iVar13)) {
          puVar18 = (undefined4 *)local_a58;
          puVar29 = (undefined4 *)local_be8;
          for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
            *puVar29 = *puVar18;
            puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
            puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
          }
          local_be8._112_4_ = local_a58._112_4_;
          local_be8[0x74] = local_a58[0x74];
          stack0xfffffffffffff490 = local_9e0;
          if (local_be8._0_4_ != 0 || (int)local_9e0 != 0) {
            local_be8[0x74] = local_a58[0x74] ^ 1;
          }
          if ((((int)local_9e0 != 2) && (local_b68._120_4_ != cpp_dec_float_NaN)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_b68,
                                  (cpp_dec_float<200U,_int,_void> *)local_be8), iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_ce8 = ZEXT816(0);
            local_cd8 = ZEXT816(0);
            local_cc8 = ZEXT816(0);
            local_cb8 = ZEXT816(0);
            local_ca8 = ZEXT816(0);
            pAVar17 = local_c48;
            goto LAB_005511b0;
          }
        }
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_ce8 = ZEXT816(0);
        local_cd8 = ZEXT816(0);
        local_cc8 = ZEXT816(0);
        local_cb8 = ZEXT816(0);
        local_ca8 = ZEXT816(0);
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c28);
        if (((local_b68._120_4_ != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
           ((iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_b68,
                                 (cpp_dec_float<200U,_int,_void> *)local_cf8), iVar13 < 0 &&
            (((local_b68._120_4_ != cpp_dec_float_NaN &&
              ((fpclass_type)local_9e0 != cpp_dec_float_NaN)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_b68,
                                  (cpp_dec_float<200U,_int,_void> *)local_a58), 0 < iVar13)))))) {
          ::soplex::infinity::__tls_init();
          local_cf8 = (undefined1  [8])0x0;
          _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_ce8 = (undefined1  [16])0x0;
          local_cd8 = (undefined1  [16])0x0;
          local_cc8 = (undefined1  [16])0x0;
          local_cb8 = (undefined1  [16])0x0;
          local_ca8 = (undefined1  [16])0x0;
          pAVar17 = local_c28;
          goto LAB_005511b0;
        }
      }
      pnVar4 = (lp_00->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar18 = (undefined4 *)((long)pnVar4[-1].m_backend.data._M_elems + uVar22);
      puVar29 = (undefined4 *)local_be8;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar29 = *puVar18;
        puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
        puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
      }
      local_be8._112_4_ = *(int *)((long)(pnVar4->m_backend).data._M_elems + uVar22 + -0x10);
      local_be8[0x74] = *(byte *)((long)(pnVar4->m_backend).data._M_elems + uVar22 + -0xc);
      unique0x00012000 =
           *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
             **)((long)(pnVar4->m_backend).data._M_elems + uVar22 + -8);
      if ((int)unique0x00012000 == 2) {
LAB_00551289:
        pAVar17 = stack0xfffffffffffff490;
        bVar11 = (bool)local_be8[0x74];
        uVar10 = local_be8._112_4_;
        puVar18 = (undefined4 *)local_be8;
        puVar29 = local_110;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          *puVar29 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
          puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
        }
        local_c18 = stack0xfffffffffffff490;
        uStack_c10 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_3d0,local_c70);
        puVar18 = local_110;
        puVar29 = (undefined4 *)local_cf8;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          *puVar29 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
          puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
        }
        iStack_c88 = uVar10;
        bStack_c84 = bVar11;
        local_c80 = pAVar17;
        if ((bVar11 == true) && (local_cf8._0_4_ != 0 || (int)local_c18 != 0)) {
          bStack_c84 = false;
        }
        uVar22 = local_c38;
        lp_00 = local_c60;
        if ((((int)local_c18 == 2) || (local_3d0.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_cf8,&local_3d0),
           uVar22 = local_c38, lp_00 = local_c60, 0 < iVar13)) goto LAB_005513f8;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        pAVar17 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x0;
LAB_00551692:
        stack0xfffffffffffff370 = 0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        bStack_c84 = false;
        iStack_c88 = 0;
        uStack_c8b = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)pAVar17);
        (*(lp_00->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(lp_00,(ulong)(iVar12 - 1),local_cf8);
        local_c58 = (ulong)((int)local_c58 + 1);
      }
      else {
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,0.0);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_be8,
                            (cpp_dec_float<200U,_int,_void> *)local_cf8);
        if (iVar13 != 0) goto LAB_00551289;
LAB_005513f8:
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c48);
        if (((local_be8._120_4_ != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_be8,
                                (cpp_dec_float<200U,_int,_void> *)local_cf8), 0 < iVar13)) {
          puVar18 = (undefined4 *)local_a58;
          puVar29 = (undefined4 *)local_ae8;
          for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
            *puVar29 = *puVar18;
            puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
            puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
          }
          iStack_a78 = local_a58._112_4_;
          bStack_a74 = local_a58[0x74];
          local_a70 = local_9e0;
          if (local_ae8._0_4_ != 0 || (int)local_9e0 != 0) {
            bStack_a74 = (bool)(local_a58[0x74] ^ 1);
          }
          if ((((int)local_9e0 != 2) && (local_be8._120_4_ != cpp_dec_float_NaN)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_be8,
                                  (cpp_dec_float<200U,_int,_void> *)local_ae8), iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_ce8 = ZEXT816(0);
            local_cd8 = ZEXT816(0);
            local_cc8 = ZEXT816(0);
            local_cb8 = ZEXT816(0);
            local_ca8 = ZEXT816(0);
            pAVar17 = local_c48;
            goto LAB_00551692;
          }
        }
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_ce8 = ZEXT816(0);
        local_cd8 = ZEXT816(0);
        local_cc8 = ZEXT816(0);
        local_cb8 = ZEXT816(0);
        local_ca8 = ZEXT816(0);
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c28);
        if (((local_be8._120_4_ != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
           ((iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_be8,
                                 (cpp_dec_float<200U,_int,_void> *)local_cf8), iVar13 < 0 &&
            (((local_be8._120_4_ != cpp_dec_float_NaN &&
              ((fpclass_type)local_9e0 != cpp_dec_float_NaN)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_be8,
                                  (cpp_dec_float<200U,_int,_void> *)local_a58), 0 < iVar13)))))) {
          ::soplex::infinity::__tls_init();
          local_cf8 = (undefined1  [8])0x0;
          _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_ce8 = (undefined1  [16])0x0;
          local_cd8 = (undefined1  [16])0x0;
          local_cc8 = (undefined1  [16])0x0;
          local_cb8 = (undefined1  [16])0x0;
          local_ca8 = (undefined1  [16])0x0;
          pAVar17 = local_c28;
          goto LAB_00551692;
        }
      }
      pnVar4 = (lp_00->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x1c00000000;
      local_cf8 = (undefined1  [8])0x0;
      _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_ce8 = (undefined1  [16])0x0;
      local_cd8 = (undefined1  [16])0x0;
      local_cc8 = (undefined1  [16])0x0;
      local_cb8 = (undefined1  [16])0x0;
      local_ca8 = (undefined1  [16])0x0;
      local_c98[0] = 0;
      local_c98[1] = 0;
      stack0xfffffffffffff370 = 0;
      uStack_c8b = 0;
      iStack_c88 = 0;
      bStack_c84 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c48);
      if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + uVar22 + -8) != 2) &&
          ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
         (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)
                              ((long)pnVar4[-1].m_backend.data._M_elems + uVar22),
                              (cpp_dec_float<200U,_int,_void> *)local_cf8), iVar13 < 1)) {
        pnVar4 = (lp_00->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_a70 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_ae8._0_16_ = (undefined1  [16])0x0;
        local_ae8._16_16_ = (undefined1  [16])0x0;
        local_ac8 = (undefined1  [16])0x0;
        local_ab8 = (undefined1  [16])0x0;
        local_aa8 = (undefined1  [16])0x0;
        local_a98 = (undefined1  [16])0x0;
        local_a88 = SUB1613((undefined1  [16])0x0,0);
        uStack_a7b = 0;
        iStack_a78 = 0;
        bStack_a74 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_ae8,(double)local_c28);
        if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + uVar22 + -8) != 2) &&
            ((fpclass_type)local_a70 != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)pnVar4[-1].m_backend.data._M_elems + uVar22),
                                (cpp_dec_float<200U,_int,_void> *)local_ae8), -1 < iVar13)) {
          this_03 = (FreeConstraintPS *)operator_new(0xd0);
          local_a68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (local_c70->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_a68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (local_c70->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_a68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_a68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_a68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_a68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_a68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          FreeConstraintPS::FreeConstraintPS(this_03,lp_00,iVar12 + -1,&local_a68);
          local_cf8 = (undefined1  [8])this_03;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_cf8 + 8),this_03);
          if (local_a68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back(&local_bf8->data,(value_type *)local_cf8);
          pSVar31 = local_c70;
          piVar14 = (local_c70->m_rIdx).data;
          piVar14[lVar15 + -1] =
               piVar14[(long)(lp_00->
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum + -1];
          (*(lp_00->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0xf])(lp_00,(ulong)(iVar12 - 1));
          piVar14 = (pSVar31->m_stat).data + 1;
          *piVar14 = *piVar14 + 1;
          if (_Stack_cf0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_cf0._M_pi);
          }
          local_c00 = (ulong)((int)local_c00 + 1);
        }
      }
      uVar22 = uVar22 + -0x80;
      bVar11 = 1 < lVar15;
      lVar15 = lVar15 + -1;
    } while (bVar11);
  }
  local_c68 = 0;
  local_c38 = 0;
  pSVar31 = local_c70;
  if (0 < (lp_00->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_c18 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                 *)((ulong)local_c28 ^ 0x8000000000000000);
    uStack_c10 = uStack_c20 ^ 0x8000000000000000;
    pAVar17 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
               *)0x0;
    local_c38 = 0;
    local_c68 = 0;
    local_c4c = 0;
    do {
      pnVar4 = (lp_00->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_c48 = pAVar17;
      pnVar23 = pnVar4 + (long)pAVar17;
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_b68;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar25->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
        pnVar23 = (pointer)((long)pnVar23 + ((ulong)bVar34 * -2 + 1) * 4);
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar34 * -8 + 4);
      }
      local_b68._112_4_ = pnVar4[(long)pAVar17].m_backend.exp;
      local_b68[0x74] = pnVar4[(long)pAVar17].m_backend.neg;
      unique0x00012000 =
           *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
             **)&pnVar4[(long)pAVar17].m_backend.fpclass;
      if ((int)unique0x00012000 == 2) {
LAB_00551a50:
        pAVar35 = stack0xfffffffffffff510;
        bVar11 = (bool)local_b68[0x74];
        uVar10 = local_b68._112_4_;
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_b68;
        puVar26 = local_180;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar26 = (pcVar25->data)._M_elems[0];
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar34 * -8 + 4);
          puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
        }
        local_bf8 = stack0xfffffffffffff510;
        uStack_bf0 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_450,pSVar31);
        puVar26 = local_180;
        puVar28 = (uint *)local_cf8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar28 = *puVar26;
          puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
          puVar28 = puVar28 + (ulong)bVar34 * -2 + 1;
        }
        iStack_c88 = uVar10;
        bStack_c84 = bVar11;
        local_c80 = pAVar35;
        if ((bVar11 == true) && (local_cf8._0_4_ != 0 || (int)local_bf8 != 0)) {
          bStack_c84 = false;
        }
        pSVar31 = local_c70;
        if ((((int)local_bf8 == 2) || (local_450.fpclass == cpp_dec_float_NaN)) ||
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_cf8,&local_450),
           pSVar31 = local_c70, 0 < iVar12)) goto LAB_00551b99;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        pAVar35 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x0;
LAB_00551e21:
        stack0xfffffffffffff370 = 0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        bStack_c84 = false;
        iStack_c88 = 0;
        uStack_c8b = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)pAVar35);
        (*(local_c60->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2a])(local_c60,local_c48,local_cf8,0);
        local_c68 = (ulong)((int)local_c68 + 1);
      }
      else {
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,0.0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_b68,
                            (cpp_dec_float<200U,_int,_void> *)local_cf8);
        if (iVar12 != 0) goto LAB_00551a50;
LAB_00551b99:
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c18);
        if (((local_b68._120_4_ != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_b68,
                                (cpp_dec_float<200U,_int,_void> *)local_cf8), 0 < iVar12)) {
          puVar18 = (undefined4 *)local_a58;
          puVar29 = (undefined4 *)local_be8;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar29 = *puVar18;
            puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
            puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
          }
          local_be8._112_4_ = local_a58._112_4_;
          local_be8[0x74] = local_a58[0x74];
          stack0xfffffffffffff490 = local_9e0;
          if (local_be8._0_4_ != 0 || (int)local_9e0 != 0) {
            local_be8[0x74] = local_a58[0x74] ^ 1;
          }
          if ((((int)local_9e0 != 2) && (local_b68._120_4_ != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_b68,
                                  (cpp_dec_float<200U,_int,_void> *)local_be8), iVar12 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_ce8 = ZEXT816(0);
            local_cd8 = ZEXT816(0);
            local_cc8 = ZEXT816(0);
            local_cb8 = ZEXT816(0);
            local_ca8 = ZEXT816(0);
            pAVar35 = local_c18;
            goto LAB_00551e21;
          }
        }
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_ce8 = ZEXT816(0);
        local_cd8 = ZEXT816(0);
        local_cc8 = ZEXT816(0);
        local_cb8 = ZEXT816(0);
        local_ca8 = ZEXT816(0);
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c28);
        if (((((local_b68._120_4_ != cpp_dec_float_NaN) &&
              ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_b68,
                                  (cpp_dec_float<200U,_int,_void> *)local_cf8), iVar12 < 0)) &&
            ((local_b68._120_4_ != cpp_dec_float_NaN &&
             ((fpclass_type)local_9e0 != cpp_dec_float_NaN)))) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_b68,
                                (cpp_dec_float<200U,_int,_void> *)local_a58), 0 < iVar12)) {
          ::soplex::infinity::__tls_init();
          local_cf8 = (undefined1  [8])0x0;
          _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_ce8 = (undefined1  [16])0x0;
          local_cd8 = (undefined1  [16])0x0;
          local_cc8 = (undefined1  [16])0x0;
          local_cb8 = (undefined1  [16])0x0;
          local_ca8 = (undefined1  [16])0x0;
          pAVar35 = local_c28;
          goto LAB_00551e21;
        }
      }
      pnVar4 = (local_c60->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar23 = pnVar4 + (long)pAVar17;
      puVar18 = (undefined4 *)local_be8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar18 = (pnVar23->m_backend).data._M_elems[0];
        pnVar23 = (pointer)((long)pnVar23 + ((ulong)bVar34 * -2 + 1) * 4);
        puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
      }
      local_be8._112_4_ = pnVar4[(long)pAVar17].m_backend.exp;
      local_be8[0x74] = pnVar4[(long)pAVar17].m_backend.neg;
      unique0x00012000 =
           *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
             **)&pnVar4[(long)pAVar17].m_backend.fpclass;
      if ((int)unique0x00012000 == 2) {
LAB_00551f0e:
        pAVar17 = stack0xfffffffffffff490;
        bVar11 = (bool)local_be8[0x74];
        uVar10 = local_be8._112_4_;
        puVar18 = (undefined4 *)local_be8;
        puVar29 = local_1f0;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar29 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
          puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
        }
        local_bf8 = stack0xfffffffffffff490;
        uStack_bf0 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_4d0,pSVar31);
        puVar18 = local_1f0;
        puVar29 = (undefined4 *)local_cf8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar29 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
          puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
        }
        iStack_c88 = uVar10;
        bStack_c84 = bVar11;
        local_c80 = pAVar17;
        if ((bVar11 == true) && (local_cf8._0_4_ != 0 || (int)local_bf8 != 0)) {
          bStack_c84 = false;
        }
        pSVar31 = local_c70;
        if ((((int)local_bf8 == 2) || (local_4d0.fpclass == cpp_dec_float_NaN)) ||
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_cf8,&local_4d0),
           pSVar31 = local_c70, 0 < iVar12)) goto LAB_00552066;
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,0.0);
        lp_00 = local_c60;
LAB_00552313:
        (*(lp_00->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2d])(lp_00,local_c48,local_cf8,0);
        local_c68 = (ulong)((int)local_c68 + 1);
      }
      else {
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,0.0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_be8,
                            (cpp_dec_float<200U,_int,_void> *)local_cf8);
        if (iVar12 != 0) goto LAB_00551f0e;
LAB_00552066:
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c18);
        lp_00 = local_c60;
        if (((local_be8._120_4_ != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_be8,
                                (cpp_dec_float<200U,_int,_void> *)local_cf8), 0 < iVar12)) {
          puVar18 = (undefined4 *)local_a58;
          puVar29 = (undefined4 *)local_ae8;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar29 = *puVar18;
            puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
            puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
          }
          iStack_a78 = local_a58._112_4_;
          bStack_a74 = local_a58[0x74];
          local_a70 = local_9e0;
          if (local_ae8._0_4_ != 0 || (int)local_9e0 != 0) {
            bStack_a74 = (bool)(local_a58[0x74] ^ 1);
          }
          if ((((int)local_9e0 == 2) || (local_be8._120_4_ == cpp_dec_float_NaN)) ||
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_be8,
                                  (cpp_dec_float<200U,_int,_void> *)local_ae8), -1 < iVar12))
          goto LAB_00552187;
          ::soplex::infinity::__tls_init();
          _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        )ZEXT816(0);
          local_ce8 = ZEXT816(0);
          local_cd8 = ZEXT816(0);
          local_cc8 = ZEXT816(0);
          local_cb8 = ZEXT816(0);
          local_ca8 = ZEXT816(0);
          pAVar17 = local_c18;
LAB_0055230e:
          stack0xfffffffffffff370 = 0;
          local_c98[0] = 0;
          local_c98[1] = 0;
          local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                       *)0x1c00000000;
          bStack_c84 = false;
          iStack_c88 = 0;
          uStack_c8b = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_cf8,(double)pAVar17);
          goto LAB_00552313;
        }
LAB_00552187:
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_ce8 = ZEXT816(0);
        local_cd8 = ZEXT816(0);
        local_cc8 = ZEXT816(0);
        local_cb8 = ZEXT816(0);
        local_ca8 = ZEXT816(0);
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c28);
        if (((((local_be8._120_4_ != cpp_dec_float_NaN) &&
              ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_be8,
                                  (cpp_dec_float<200U,_int,_void> *)local_cf8), iVar12 < 0)) &&
            ((local_be8._120_4_ != cpp_dec_float_NaN &&
             ((fpclass_type)local_9e0 != cpp_dec_float_NaN)))) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_be8,
                                (cpp_dec_float<200U,_int,_void> *)local_a58), 0 < iVar12)) {
          ::soplex::infinity::__tls_init();
          local_cf8 = (undefined1  [8])0x0;
          _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_ce8 = (undefined1  [16])0x0;
          local_cd8 = (undefined1  [16])0x0;
          local_cc8 = (undefined1  [16])0x0;
          local_cb8 = (undefined1  [16])0x0;
          local_ca8 = (undefined1  [16])0x0;
          pAVar17 = local_c28;
          goto LAB_0055230e;
        }
      }
      puVar18 = (undefined4 *)local_b68;
      puVar29 = (undefined4 *)local_750;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar29 = *puVar18;
        puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
        puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
      }
      local_750._112_4_ = local_b68._112_4_;
      local_750[0x74] = (bool)local_b68[0x74];
      local_750._120_8_ = stack0xfffffffffffff510;
      puVar26 = (uint *)local_be8;
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_5d0;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar21->m_backend).data._M_elems[0] = *puVar26;
        puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
        pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar21 + ((ulong)bVar34 * -2 + 1) * 4);
      }
      local_5d0._112_4_ = local_be8._112_4_;
      local_5d0[0x74] = (bool)local_be8[0x74];
      local_5d0._120_8_ = stack0xfffffffffffff490;
      this_01 = (pSVar31->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      this_02 = (pSVar31->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      eps = Tolerances::epsilon(this_01);
      bVar11 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_750,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_5d0,eps);
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      if (bVar11) {
        if ((bool)local_b68[0x74] == true) {
          local_b68[0x74] = local_b68._0_4_ == 0 && local_b68._120_4_ == cpp_dec_float_finite;
        }
        if ((bool)local_be8[0x74] == true) {
          local_be8[0x74] = local_be8._0_4_ == 0 && local_be8._120_4_ == cpp_dec_float_finite;
        }
        if (local_be8._120_4_ == cpp_dec_float_NaN || local_b68._120_4_ == cpp_dec_float_NaN) {
          bVar11 = false;
        }
        else {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_b68,
                              (cpp_dec_float<200U,_int,_void> *)local_be8);
          bVar11 = 0 < iVar12;
        }
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_be8;
        if (bVar11) {
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_b68;
        }
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_ae8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar25->data)._M_elems[0];
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar34 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar34 * -8 + 4);
        }
        puVar8 = local_be8;
        if (bVar11) {
          puVar8 = local_b68;
        }
        iStack_a78 = *(int *)(puVar8 + 0x70);
        puVar8 = local_be8;
        if (bVar11) {
          puVar8 = local_b68;
        }
        bStack_a74 = (bool)puVar8[0x74];
        puVar8 = local_be8;
        if (bVar11) {
          puVar8 = local_b68;
        }
        fVar1 = *(fpclass_type *)(puVar8 + 0x78);
        puVar18 = &uStack_b6c;
        if (bVar11) {
          puVar18 = &uStack_aec;
        }
        local_a70._0_4_ = fVar1;
        local_a70 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)CONCAT44(*puVar18,fVar1);
        if (fVar1 != cpp_dec_float_NaN) {
          local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                       *)0x1c00000000;
          local_cf8 = (undefined1  [8])0x0;
          _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_ce8 = (undefined1  [16])0x0;
          local_cd8 = (undefined1  [16])0x0;
          local_cc8 = (undefined1  [16])0x0;
          local_cb8 = (undefined1  [16])0x0;
          local_ca8 = (undefined1  [16])0x0;
          local_c98[0] = 0;
          local_c98[1] = 0;
          stack0xfffffffffffff370 = 0;
          uStack_c8b = 0;
          iStack_c88 = 0;
          bStack_c84 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_cf8,1.0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_ae8,
                              (cpp_dec_float<200U,_int,_void> *)local_cf8);
          if (iVar12 < 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_ae8,1.0);
          }
        }
        pIVar5 = (lp_00->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar12 = (lp_00->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[(long)local_c48].idx;
        lp_00 = local_c60;
        if (0 < pIVar5[iVar12].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
          pIVar5 = pIVar5 + iVar12;
          uVar32 = 0;
          do {
            pNVar6 = (pIVar5->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar24 = pNVar6 + (int)uVar32;
            puVar26 = local_2d0;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar26 = (pNVar24->val).m_backend.data._M_elems[0];
              pNVar24 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pNVar24 + ((ulong)bVar34 * -2 + 1) * 4);
              puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
            }
            iVar12 = pNVar6[(int)uVar32].val.m_backend.exp;
            bVar11 = pNVar6[(int)uVar32].val.m_backend.neg;
            fVar1 = pNVar6[(int)uVar32].val.m_backend.fpclass;
            iVar2 = pNVar6[(int)uVar32].val.m_backend.prec_elem;
            local_960._0_4_ = cpp_dec_float_finite;
            local_960._4_4_ = 0x1c;
            local_9d8[0x74] = false;
            local_9d8._112_4_ = 0;
            puVar26 = local_2d0;
            puVar28 = (uint *)local_9d8;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar28 = *puVar26;
              puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
              puVar28 = puVar28 + (ulong)bVar34 * -2 + 1;
            }
            local_9d8._112_4_ = iVar12;
            local_9d8[0x74] = bVar11;
            local_960 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                         *)CONCAT44(iVar2,fVar1);
            if ((bVar11 == true) && (local_9d8._0_4_ != 0 || fVar1 != cpp_dec_float_finite)) {
              local_9d8[0x74] = false;
            }
            local_858._0_4_ = cpp_dec_float_finite;
            local_858._4_4_ = 0x1c;
            local_8d0[0x74] = false;
            local_8d0._112_4_ = 0;
            puVar26 = local_2d0;
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_8d0;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pcVar25->data)._M_elems[0] = *puVar26;
              puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar34 * -8 + 4);
            }
            local_8d0[0x74] = (bool)local_9d8[0x74];
            local_858 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                         *)CONCAT44(iVar2,fVar1);
            local_8d0._112_4_ = iVar12;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_8d0,
                       (cpp_dec_float<200U,_int,_void> *)local_ae8);
            pAVar17 = local_8e0;
            puVar18 = (undefined4 *)local_958;
            puVar29 = (undefined4 *)local_7d0;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar29 = *puVar18;
              puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
              puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
            }
            local_7d0._112_4_ = local_958._112_4_;
            local_7d0[0x74] = local_958[0x74];
            local_7d0._120_8_ = local_8e0;
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_8d0;
            puVar26 = (uint *)local_cf8;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar26 = (pcVar25->data)._M_elems[0];
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar34 * -8 + 4);
              puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
            }
            iStack_c88 = local_8d0._112_4_;
            bStack_c84 = local_8d0[0x74];
            local_c80 = local_858;
            if ((local_8d0[0x74] == true) && (local_cf8._0_4_ != 0 || (int)local_858 != 0)) {
              bStack_c84 = false;
            }
            if (((int)pAVar17 == 2 || (int)local_858 == 2) ||
               (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_cf8,
                                    (cpp_dec_float<200U,_int,_void> *)local_7d0), 0 < iVar12)) {
              if (((fpclass_type)local_960 == cpp_dec_float_NaN) ||
                 (((fpclass_type)local_9e0 == cpp_dec_float_NaN ||
                  (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      ((cpp_dec_float<200U,_int,_void> *)local_9d8,
                                       (cpp_dec_float<200U,_int,_void> *)local_a58), iVar12 < 1))))
              {
                puVar18 = (undefined4 *)local_9d8;
                puVar29 = (undefined4 *)local_cf8;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  *puVar29 = *puVar18;
                  puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
                  puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
                }
                puVar18 = (undefined4 *)local_958;
                puVar29 = (undefined4 *)local_850;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  *puVar29 = *puVar18;
                  puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
                  puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
                }
                local_850._112_4_ = local_958._112_4_;
                local_850[0x74] = local_958[0x74];
                local_850._120_8_ = local_8e0;
                iStack_c88 = local_9d8._112_4_;
                bStack_c84 = (bool)local_9d8[0x74];
                local_c80 = local_960;
                if (((bool)local_9d8[0x74] == true) && (local_cf8._0_4_ != 0 || (int)local_960 != 0)
                   ) {
                  bStack_c84 = false;
                }
                if (((((int)local_8e0 != 2 && (int)local_960 != 2) &&
                     (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare((cpp_dec_float<200U,_int,_void> *)local_cf8,
                                       (cpp_dec_float<200U,_int,_void> *)local_850), iVar12 < 1)) &&
                    (pSVar33 = (local_c70->
                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).spxout, pSVar33 != (SPxOut *)0x0)) &&
                   (0 < (int)pSVar33->m_verbosity)) {
                  local_cf8._0_4_ = pSVar33->m_verbosity;
                  local_c2c = 1;
                  (*pSVar33->_vptr_SPxOut[2])(pSVar33,&local_c2c);
                  pSVar31 = local_c70;
                  pSVar33 = (local_c70->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pSVar33->m_streams[pSVar33->m_verbosity],
                             "WMAISM06 Warning! Tiny matrix coefficient ",0x2a);
                  pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_6d0;
                  puVar26 = (uint *)local_9d8;
                  pnVar30 = pnVar21;
                  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                    (pnVar30->m_backend).data._M_elems[0] = *puVar26;
                    puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
                    pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar30 + ((ulong)bVar34 * -2 + 1) * 4);
                  }
                  local_6d0._112_4_ = local_9d8._112_4_;
                  local_6d0[0x74] = (bool)local_9d8[0x74];
                  local_6d0._120_8_ = local_960;
                  goto LAB_00552a4c;
                }
              }
              else {
                pSVar33 = (local_c70->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).spxout;
                if ((pSVar33 != (SPxOut *)0x0) && (0 < (int)pSVar33->m_verbosity)) {
                  local_cf8._0_4_ = pSVar33->m_verbosity;
                  local_c2c = 1;
                  (*pSVar33->_vptr_SPxOut[2])(pSVar33,&local_c2c);
                  pSVar31 = local_c70;
                  pSVar33 = (local_c70->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pSVar33->m_streams[pSVar33->m_verbosity],
                             "WMAISM05 Warning! Big matrix coefficient ",0x29);
                  pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_650;
                  puVar26 = (uint *)local_9d8;
                  pnVar30 = pnVar21;
                  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                    (pnVar30->m_backend).data._M_elems[0] = *puVar26;
                    puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
                    pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar30 + ((ulong)bVar34 * -2 + 1) * 4);
                  }
                  local_650._112_4_ = local_9d8._112_4_;
                  local_650[0x74] = (bool)local_9d8[0x74];
                  local_650._120_8_ = local_960;
LAB_00552a4c:
                  boost::multiprecision::operator<<
                            (pSVar33->m_streams[pSVar33->m_verbosity],pnVar21);
                  cVar7 = (char)pSVar33->m_streams[pSVar33->m_verbosity];
                  std::ios::widen((char)*(undefined8 *)
                                         (*(long *)pSVar33->m_streams[pSVar33->m_verbosity] + -0x18)
                                  + cVar7);
                  std::ostream::put(cVar7);
                  std::ostream::flush();
                  pSVar33 = (pSVar31->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  (*pSVar33->_vptr_SPxOut[2])(pSVar33,local_cf8);
                }
              }
              uVar32 = uVar32 + 1;
            }
            else {
              this_00 = (local_c60->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.theitem +
                        (local_c60->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thekey
                        [(pIVar5->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem[(int)uVar32].idx].idx;
              pNVar6 = (this_00->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              if ((pNVar6 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x0) ||
                 (pcVar19 = (char *)(long)(this_00->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .memused, (long)pcVar19 < 1)) {
LAB_00552b37:
                __filename = (char *)0xffffffff;
              }
              else {
                if (local_c48 ==
                    (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)(ulong)(uint)pNVar6->idx) {
                  bVar11 = true;
                  __filename = (char *)0x0;
                }
                else {
                  piVar14 = &pNVar6[1].idx;
                  __filename = (char *)0x0;
                  do {
                    if (pcVar19 + -1 == __filename) goto LAB_00552b37;
                    uVar3 = *piVar14;
                    piVar14 = piVar14 + 0x21;
                    __filename = __filename + 1;
                  } while (local_c48 !=
                           (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                            *)(ulong)uVar3);
                  bVar11 = __filename < pcVar19;
                }
                if (!bVar11) goto LAB_00552b37;
              }
              if (-1 < (int)__filename) {
                SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)this_00,__filename);
              }
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)pIVar5,(char *)(ulong)uVar32);
              local_c38 = (ulong)((int)local_c38 + 1);
            }
            lp_00 = local_c60;
          } while ((int)uVar32 <
                   (pIVar5->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused);
        }
      }
      pSVar31 = local_c70;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_ae8,lp_00,(int)local_c48);
      if ((fpclass_type)local_a70 == cpp_dec_float_NaN) {
LAB_00552c0d:
        pAVar17 = local_a70;
        bVar11 = bStack_a74;
        iVar12 = iStack_a78;
        puVar18 = (undefined4 *)local_ae8;
        puVar29 = local_260;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar29 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
          puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
        }
        local_bf8 = local_a70;
        uStack_bf0 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_550,pSVar31);
        puVar18 = local_260;
        puVar29 = (undefined4 *)local_cf8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar29 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
          puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
        }
        iStack_c88 = iVar12;
        bStack_c84 = bVar11;
        local_c80 = pAVar17;
        if ((bVar11 == true) && (local_cf8._0_4_ != 0 || (int)local_bf8 != 0)) {
          bStack_c84 = false;
        }
        pSVar31 = local_c70;
        lp_00 = local_c60;
        if ((((int)local_bf8 == 2) || (local_550.fpclass == cpp_dec_float_NaN)) ||
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_cf8,&local_550),
           pSVar31 = local_c70, lp_00 = local_c60, 0 < iVar12)) goto LAB_00552d68;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        pAVar17 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x0;
LAB_00553008:
        stack0xfffffffffffff370 = 0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        bStack_c84 = false;
        iStack_c88 = 0;
        uStack_c8b = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)pAVar17);
        (*(lp_00->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x24])(lp_00,local_c48,local_cf8,0);
        local_c4c = local_c4c + 1;
      }
      else {
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,0.0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_ae8,
                            (cpp_dec_float<200U,_int,_void> *)local_cf8);
        if (iVar12 != 0) goto LAB_00552c0d;
LAB_00552d68:
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        local_cf8 = (undefined1  [8])0x0;
        _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8 = (undefined1  [16])0x0;
        local_ca8 = (undefined1  [16])0x0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c18);
        if ((((fpclass_type)local_a70 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_ae8,
                                (cpp_dec_float<200U,_int,_void> *)local_cf8), 0 < iVar12)) {
          puVar18 = (undefined4 *)local_a58;
          puVar29 = (undefined4 *)local_9d8;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar29 = *puVar18;
            puVar18 = puVar18 + (ulong)bVar34 * -2 + 1;
            puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
          }
          local_9d8._112_4_ = local_a58._112_4_;
          local_9d8[0x74] = local_a58[0x74];
          local_960 = local_9e0;
          if (local_9d8._0_4_ != 0 || (int)local_9e0 != 0) {
            local_9d8[0x74] = local_a58[0x74] ^ 1;
          }
          if ((((int)local_9e0 != 2) && ((fpclass_type)local_a70 != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_ae8,
                                  (cpp_dec_float<200U,_int,_void> *)local_9d8), iVar12 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_ce8 = ZEXT816(0);
            local_cd8 = ZEXT816(0);
            local_cc8 = ZEXT816(0);
            local_cb8 = ZEXT816(0);
            local_ca8 = ZEXT816(0);
            pAVar17 = local_c18;
            goto LAB_00553008;
          }
        }
        ::soplex::infinity::__tls_init();
        local_c80 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0x1c00000000;
        _local_cf8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_ce8 = ZEXT816(0);
        local_cd8 = ZEXT816(0);
        local_cc8 = ZEXT816(0);
        local_cb8 = ZEXT816(0);
        local_ca8 = ZEXT816(0);
        local_c98[0] = 0;
        local_c98[1] = 0;
        stack0xfffffffffffff370 = 0;
        uStack_c8b = 0;
        iStack_c88 = 0;
        bStack_c84 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_cf8,(double)local_c28);
        if ((((((fpclass_type)local_a70 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_c80 != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_ae8,
                                  (cpp_dec_float<200U,_int,_void> *)local_cf8), iVar12 < 0)) &&
            (((fpclass_type)local_a70 != cpp_dec_float_NaN &&
             ((fpclass_type)local_9e0 != cpp_dec_float_NaN)))) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_ae8,
                                (cpp_dec_float<200U,_int,_void> *)local_a58), 0 < iVar12)) {
          ::soplex::infinity::__tls_init();
          local_cf8 = (undefined1  [8])0x0;
          _Stack_cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_ce8 = (undefined1  [16])0x0;
          local_cd8 = (undefined1  [16])0x0;
          local_cc8 = (undefined1  [16])0x0;
          local_cb8 = (undefined1  [16])0x0;
          local_ca8 = (undefined1  [16])0x0;
          pAVar17 = local_c28;
          goto LAB_00553008;
        }
      }
      pAVar17 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                 *)((long)&(local_c48->data).
                           super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
    } while ((long)pAVar17 <
             (long)(lp_00->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
  }
  iVar9 = local_c4c;
  iVar12 = (int)local_c58;
  iVar13 = (int)local_c00;
  iVar20 = (int)local_c38;
  if (0 < iVar12 + iVar13 + local_c4c + (int)local_c68 + iVar20) {
    piVar14 = &(pSVar31->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remRows;
    *piVar14 = *piVar14 + iVar13;
    piVar14 = &(pSVar31->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remNzos;
    *piVar14 = *piVar14 + iVar20;
    piVar14 = &(pSVar31->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgLRhs;
    *piVar14 = *piVar14 + iVar12;
    piVar14 = &(pSVar31->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar14 = *piVar14 + (int)local_c68;
    pSVar33 = (pSVar31->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar33 != (SPxOut *)0x0) && (3 < (int)pSVar33->m_verbosity)) {
      local_cf8._0_4_ = pSVar33->m_verbosity;
      local_b68._0_4_ = 4;
      (*pSVar33->_vptr_SPxOut[2])();
      pSVar33 = (pSVar31->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar33->m_streams[pSVar33->m_verbosity],"Simplifier (extremes) removed ",0x1e);
      std::ostream::operator<<((ostream *)pSVar33->m_streams[pSVar33->m_verbosity],iVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar33->m_streams[pSVar33->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar33->m_streams[pSVar33->m_verbosity],iVar20);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar33->m_streams[pSVar33->m_verbosity]," non-zeros, ",0xc);
      std::ostream::operator<<((ostream *)pSVar33->m_streams[pSVar33->m_verbosity],(int)local_c68);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar33->m_streams[pSVar33->m_verbosity]," col bounds, ",0xd);
      std::ostream::operator<<((ostream *)pSVar33->m_streams[pSVar33->m_verbosity],iVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar33->m_streams[pSVar33->m_verbosity]," row bounds, ",0xd);
      std::ostream::operator<<((ostream *)pSVar33->m_streams[pSVar33->m_verbosity],iVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar33->m_streams[pSVar33->m_verbosity]," objective coefficients",0x17);
      cVar7 = (char)pSVar33->m_streams[pSVar33->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar33->m_streams[pSVar33->m_verbosity] + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      pSVar33 = (pSVar31->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar33->_vptr_SPxOut[2])(pSVar33,local_cf8);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::handleExtremes(SPxLPBase<R>& lp)
{

   // This method handles extreme value of the given LP by
   //
   // 1. setting numbers of very small absolute values to zero and
   // 2. setting numbers of very large absolute values to R(-infinity) or +R(infinity), respectively.

   R maxVal  = R(infinity) / 5.0;
   R tol = feastol() * 1e-2;
   tol = (tol < this->epsZero()) ? this->epsZero() : tol;
   int  remRows = 0;
   int  remNzos = 0;
   int  chgBnds = 0;
   int  chgLRhs = 0;
   int  objCnt  = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // lhs
      R lhs = lp.lhs(i);

      if(lhs != 0.0 && isZero(lhs, this->epsZero()))
      {
         lp.changeLhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(lhs > R(-infinity) && lhs < -maxVal)
      {
         lp.changeLhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(lhs <  R(infinity) && lhs >  maxVal)
      {
         lp.changeLhs(i,  R(infinity));
         ++chgLRhs;
      }

      // rhs
      R rhs = lp.rhs(i);

      if(rhs != 0.0 && isZero(rhs, this->epsZero()))
      {
         lp.changeRhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(rhs > R(-infinity) && rhs < -maxVal)
      {
         lp.changeRhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(rhs <  R(infinity) && rhs >  maxVal)
      {
         lp.changeRhs(i,  R(infinity));
         ++chgLRhs;
      }

      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         removeRow(lp, i);
         ++remRows;

         ++m_stat[FREE_ROW];
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      // lower bound
      R lo = lp.lower(j);

      if(lo != 0.0 && isZero(lo, this->epsZero()))
      {
         lp.changeLower(j, R(0.0));
         ++chgBnds;
      }
      else if(lo > R(-infinity) && lo < -maxVal)
      {
         lp.changeLower(j, R(-infinity));
         ++chgBnds;
      }
      else if(lo <  R(infinity) && lo >  maxVal)
      {
         lp.changeLower(j,  R(infinity));
         ++chgBnds;
      }

      // upper bound
      R up = lp.upper(j);

      if(up != 0.0 && isZero(up, this->epsZero()))
      {
         lp.changeUpper(j, R(0.0));
         ++chgBnds;
      }
      else if(up > R(-infinity) && up < -maxVal)
      {
         lp.changeUpper(j, R(-infinity));
         ++chgBnds;
      }
      else if(up <  R(infinity) && up >  maxVal)
      {
         lp.changeUpper(j,  R(infinity));
         ++chgBnds;
      }

      // fixed columns will be eliminated later
      if(NE(lo, up, this->tolerances()->epsilon()))
      {
         lo = spxAbs(lo);
         up = spxAbs(up);

         R absBnd = (lo > up) ? lo : up;

         if(absBnd < 1.0)
            absBnd = 1.0;

         // non-zeros
         SVectorBase<R>& col = lp.colVector_w(j);
         int        i = 0;

         while(i < col.size())
         {
            R aij = spxAbs(col.value(i));

            if(isZero(aij * absBnd, tol))
            {
               SVectorBase<R>& row = lp.rowVector_w(col.index(i));
               int row_j = row.pos(j);

               // this changes col.size()
               if(row_j >= 0)
                  row.remove(row_j);

               col.remove(i);

               SPxOut::debug(this, "IMAISM04 aij={}  removed, absBnd={} \n", aij, absBnd);
               ++remNzos;
            }
            else
            {
               if(aij > maxVal)
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM05 Warning! Big matrix coefficient " << aij
                                  << std::endl);
               }
               else if(isZero(aij, tol))
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM06 Warning! Tiny matrix coefficient " << aij
                                  << std::endl);
               }

               ++i;
            }
         }
      }

      // objective
      R obj = lp.obj(j);

      if(obj != 0.0 && isZero(obj, this->epsZero()))
      {
         lp.changeObj(j, R(0.0));
         ++objCnt;
      }
      else if(obj > R(-infinity) && obj < -maxVal)
      {
         lp.changeObj(j, R(-infinity));
         ++objCnt;
      }
      else if(obj <  R(infinity) && obj >  maxVal)
      {
         lp.changeObj(j,  R(infinity));
         ++objCnt;
      }
   }

   if(remRows + remNzos + chgLRhs + chgBnds + objCnt > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;
      this->m_chgLRhs += chgLRhs;
      this->m_chgBnds += chgBnds;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (extremes) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros, "
                    << chgBnds << " col bounds, "
                    << chgLRhs << " row bounds, "
                    << objCnt  << " objective coefficients" << std::endl;)
   }

   assert(lp.isConsistent());
}